

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REV_EVevent_list_response_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,attr_list attrs)

{
  undefined8 *puVar1;
  EVevent_list pbVar2;
  CManager_conflict in_RDX;
  EV_EVevent_list_response *stub_ptr;
  EV_EVevent_list_response *response;
  undefined8 in_stack_ffffffffffffffc8;
  CManager_conflict cm_00;
  
  cm_00 = in_RDX;
  puVar1 = (undefined8 *)
           CMCondition_get_client_data(in_RDX,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = in_RDX->transports;
    puVar1[1] = *(undefined8 *)&in_RDX->initialized;
    pbVar2 = copy_EVevent_list((EVevent_list)cm_00);
    puVar1[1] = pbVar2;
  }
  CMCondition_signal(cm_00,(int)((ulong)puVar1 >> 0x20));
  return;
}

Assistant:

static void
REV_EVevent_list_response_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list attrs)
{
    EV_EVevent_list_response *response = (EV_EVevent_list_response*) data;
    EV_EVevent_list_response *stub_ptr = CMCondition_get_client_data(cm, response->condition_var);
    if (NULL != stub_ptr) {
        memcpy(stub_ptr, data, sizeof(EV_EVevent_list_response));
        stub_ptr->ret = copy_EVevent_list(response->ret);
    }
    CMCondition_signal(cm, response->condition_var);
}